

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3phseg_io.c
# Opt level: O2

int s3lattice_read(char *fn,s3lattice_t **lattice)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  s3lattice_t *psVar3;
  char *pcVar4;
  s3arc_s *psVar5;
  uint32 *puVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint32 id;
  char temp [16];
  char line [1024];
  
  __stream = fopen(fn,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
            ,0xb7,"Failed to open lattice file %s\n",fn);
  }
  else {
    psVar3 = (s3lattice_t *)
             __ckd_calloc__(1,0x20,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                            ,0xbb);
    fgets(line,0x400,__stream);
    pcVar4 = strstr(line,"Total arcs");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "Lattice Format Error, missing Total arcs\n";
      lVar7 = 0xc1;
    }
    else {
      fgets(line,0x400,__stream);
      iVar2 = __isoc99_sscanf(line,"%d",psVar3);
      if (iVar2 == 1) {
        if (psVar3->n_arcs == 0) {
          pcVar4 = "No arc exits in the lattice\n";
          lVar7 = 0xcb;
        }
        else {
          fgets(line,0x400,__stream);
          pcVar4 = strstr(line,"True arcs");
          if (pcVar4 == (char *)0x0) {
            pcVar4 = "Lattice Format Error, missing True arcs\n";
            lVar7 = 0xd2;
          }
          else {
            fgets(line,0x400,__stream);
            iVar2 = __isoc99_sscanf(line,"%d",&psVar3->n_true_arcs);
            if (iVar2 == 1) {
              uVar1 = psVar3->n_true_arcs;
              if (uVar1 == 0) {
                pcVar4 = "No arc from the numerator lattice\n";
                lVar7 = 0xdc;
              }
              else if (psVar3->n_arcs < uVar1) {
                pcVar4 = 
                "The number of arcs from numerator lattice is larger than the number of total arcs\n"
                ;
                lVar7 = 0xe0;
              }
              else {
                fgets(line,0x400,__stream);
                pcVar4 = strstr(line,"arc_id");
                if (pcVar4 == (char *)0x0) {
                  pcVar4 = "Lattice Format Error\n";
                  lVar7 = 0xe7;
                }
                else {
                  psVar5 = (s3arc_s *)
                           __ckd_calloc__((ulong)psVar3->n_arcs,0xd8,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                                          ,0xec);
                  psVar3->arc = psVar5;
                  uVar8 = 0;
                  while( true ) {
                    iVar2 = __isoc99_fscanf(__stream,"%d",&id);
                    if (iVar2 == -1) {
                      fclose(__stream);
                      *lattice = psVar3;
                      return 0;
                    }
                    __isoc99_fscanf(__stream,"%s",psVar3->arc + uVar8);
                    __isoc99_fscanf(__stream,"%d",&psVar3->arc[uVar8].sf);
                    __isoc99_fscanf(__stream,"%d",&psVar3->arc[uVar8].ef);
                    __isoc99_fscanf(__stream,"%lf",&psVar3->arc[uVar8].lm_score);
                    __isoc99_fscanf(__stream,"%d",&psVar3->arc[uVar8].n_prev_arcs);
                    __isoc99_fscanf(__stream,"%d",&psVar3->arc[uVar8].n_next_arcs);
                    __isoc99_fscanf(__stream,"%s",temp);
                    uVar9 = (ulong)psVar3->arc[uVar8].n_prev_arcs;
                    if (uVar9 == 0) break;
                    puVar6 = (uint32 *)
                             __ckd_calloc__(uVar9,4,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                                            ,0xfe);
                    psVar5 = psVar3->arc;
                    psVar5[uVar8].prev_arcs = puVar6;
                    lVar7 = 0;
                    for (uVar9 = 0; uVar9 < psVar5[uVar8].n_prev_arcs; uVar9 = uVar9 + 1) {
                      __isoc99_fscanf(__stream,"%d",(long)psVar5[uVar8].prev_arcs + lVar7);
                      psVar5 = psVar3->arc;
                      lVar7 = lVar7 + 4;
                    }
                    __isoc99_fscanf(__stream,"%s",temp);
                    uVar9 = (ulong)psVar3->arc[uVar8].n_next_arcs;
                    if (uVar9 == 0) {
                      pcVar4 = "No succeeding arc exits\n";
                      lVar7 = 0x105;
                      goto LAB_0010f2af;
                    }
                    puVar6 = (uint32 *)
                             __ckd_calloc__(uVar9,4,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                                            ,0x108);
                    psVar5 = psVar3->arc;
                    psVar5[uVar8].next_arcs = puVar6;
                    lVar7 = 0;
                    for (uVar9 = 0; uVar9 < psVar5[uVar8].n_next_arcs; uVar9 = uVar9 + 1) {
                      __isoc99_fscanf(__stream,"%d",(long)psVar5[uVar8].next_arcs + lVar7);
                      psVar5 = psVar3->arc;
                      lVar7 = lVar7 + 4;
                    }
                    uVar8 = (ulong)((int)uVar8 + 1);
                  }
                  pcVar4 = "No preceding arc exits\n";
                  lVar7 = 0xfb;
                }
              }
            }
            else {
              pcVar4 = "Lattice Format Error, missing True arcs\n";
              lVar7 = 0xd8;
            }
          }
        }
      }
      else {
        pcVar4 = "Lattice Format Error, missing Total arcs\n";
        lVar7 = 199;
      }
    }
LAB_0010f2af:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
            ,lVar7,pcVar4);
    fclose(__stream);
  }
  return -1;
}

Assistant:

int
s3lattice_read(const char *fn,
	       s3lattice_t **lattice)
{
  FILE *fp;
  uint32 id;
  char line[1024], temp[16];
  s3lattice_t *out_lattice;
  uint32 i, j, n;
  
  if ((fp = fopen(fn, "r")) == NULL) {
    E_ERROR("Failed to open lattice file %s\n", fn);
    return S3_ERROR;
  }
  
  out_lattice = ckd_calloc(1, sizeof(*out_lattice));
  
  /* process file head */
  /* read the number of total arcs */
  fgets(line, sizeof(line), fp);
  if (strstr(line, "Total arcs") == NULL) {
    E_ERROR("Lattice Format Error, missing Total arcs\n");
    goto error_out;
  }
  fgets(line, sizeof(line), fp);
  n = sscanf(line, "%d", &out_lattice->n_arcs);
  if (n!=1) {
    E_ERROR("Lattice Format Error, missing Total arcs\n");
    goto error_out;
  }
  if (out_lattice->n_arcs == 0) {
    E_ERROR("No arc exits in the lattice\n");
    goto error_out;
  }

  /* read the number of true arcs */
  fgets(line, sizeof(line), fp);
  if (strstr(line, "True arcs") == NULL) {
    E_ERROR("Lattice Format Error, missing True arcs\n");
    goto error_out;
  }
  fgets(line, sizeof(line), fp);
  n = sscanf(line, "%d", &out_lattice->n_true_arcs);
  if (n!=1) {
    E_ERROR("Lattice Format Error, missing True arcs\n");
    goto error_out;
  }
  if (out_lattice->n_true_arcs == 0) {
    E_ERROR("No arc from the numerator lattice\n");
    goto error_out;
  }
  if (out_lattice->n_true_arcs > out_lattice->n_arcs) {
    E_ERROR("The number of arcs from numerator lattice is larger than the number of total arcs\n");
    goto error_out;
  }

  /* read parameter lists */
  fgets(line, sizeof(line), fp);
  if (strstr(line, "arc_id") == NULL) {
    E_ERROR("Lattice Format Error\n");
    goto error_out;
  }
  
  /* allocate memory for arcs */
  out_lattice->arc = ckd_calloc(out_lattice->n_arcs, sizeof(*out_lattice->arc));
  
  i = 0;
  /* Get each arc */
  while (fscanf(fp, "%d", &id) != EOF) {/* arc id */
    fscanf(fp, "%s", out_lattice->arc[i].word);/* word */
    fscanf(fp, "%d", &out_lattice->arc[i].sf);/* start frame */
    fscanf(fp, "%d", &out_lattice->arc[i].ef);/* end frame */
    fscanf(fp, "%lf", &out_lattice->arc[i].lm_score);/* LM score */
    fscanf(fp, "%d", &out_lattice->arc[i].n_prev_arcs);/* num of previous arcs */
    fscanf(fp, "%d", &out_lattice->arc[i].n_next_arcs);/* num of succeeding arcs */
    
    /* read preceding arc ids */
    fscanf(fp, "%s", temp);/* move over '<' */
    if (out_lattice->arc[i].n_prev_arcs == 0) {
      E_ERROR("No preceding arc exits\n");
      goto error_out;
    }
    out_lattice->arc[i].prev_arcs = ckd_calloc(out_lattice->arc[i].n_prev_arcs, sizeof(int));
    for (j=0; j<out_lattice->arc[i].n_prev_arcs; j++)
      fscanf(fp, "%d", &out_lattice->arc[i].prev_arcs[j]);
    
    /* read succeeding arc ids */
    fscanf(fp, "%s", temp);/* move over '<' */
    if (out_lattice->arc[i].n_next_arcs == 0) {
      E_ERROR("No succeeding arc exits\n");
      goto error_out;
    }
    out_lattice->arc[i].next_arcs = ckd_calloc(out_lattice->arc[i].n_next_arcs, sizeof(int));
    for (j=0; j<out_lattice->arc[i].n_next_arcs; j++)
      fscanf(fp, "%d", &out_lattice->arc[i].next_arcs[j]);
    
    i++;
  }
  fclose(fp);
  
  *lattice = out_lattice;
  
  return S3_SUCCESS;
 error_out:
  fclose(fp);
  return S3_ERROR;
}